

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::detail::DispatchSplitCPU<4>::operator()
          (void *param_1,undefined8 param_2,
          TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          *param_3,int param_4)

{
  array<float,_4> aVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  SampledSpectrum SVar8;
  int mid;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_68;
  undefined8 local_60;
  DispatchSplitCPU<2> local_52 [2];
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_50;
  undefined8 local_48;
  DispatchSplitCPU<2> local_39;
  undefined4 local_38;
  int local_34;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *local_30;
  void *local_28;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar4 [56];
  undefined1 auVar7 [56];
  
  auVar7 = in_ZMM1._8_56_;
  auVar4 = in_ZMM0._8_56_;
  local_38 = 2;
  local_34 = param_4;
  local_30 = param_3;
  local_28 = param_1;
  local_18 = param_2;
  if (param_4 + -1 < 2) {
    local_48 = param_2;
    TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ::TaggedPointer(&local_50,param_3);
    SVar8 = DispatchSplitCPU<2>::operator()(&local_39,local_48,&local_50,local_34);
    auVar5._0_8_ = SVar8.values.values._8_8_;
    auVar5._8_56_ = auVar7;
    auVar2._0_8_ = SVar8.values.values._0_8_;
    auVar2._8_56_ = auVar4;
    local_10 = vmovlpd_avx(auVar2._0_16_);
    local_8 = vmovlpd_avx(auVar5._0_16_);
  }
  else {
    local_60 = param_2;
    TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ::TaggedPointer(&local_68,param_3);
    SVar8 = DispatchSplitCPU<2>::operator()(local_52,local_60,&local_68,local_34 + -2);
    auVar6._0_8_ = SVar8.values.values._8_8_;
    auVar6._8_56_ = auVar7;
    auVar3._0_8_ = SVar8.values.values._0_8_;
    auVar3._8_56_ = auVar4;
    local_10 = vmovlpd_avx(auVar3._0_16_);
    local_8 = vmovlpd_avx(auVar6._0_16_);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplitCPU<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplitCPU<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }